

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall HdlcAnalyzerSettings::SetSettingsFromInterfaces(HdlcAnalyzerSettings *this)

{
  U32 UVar1;
  double dVar2;
  Channel local_20 [16];
  HdlcAnalyzerSettings *local_10;
  HdlcAnalyzerSettings *this_local;
  
  local_10 = this;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,local_20);
  Channel::~Channel(local_20);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcTransmissionInterface);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mTransmissionMode = (HdlcTransmissionModeType)(long)dVar2;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcAddrInterface);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcAddr = (HdlcAddressType)(long)dVar2;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcControlInterface);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcControl = (HdlcControlType)(long)dVar2;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcFcs = (HdlcFcsType)(long)dVar2;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool HdlcAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    mBitRate = mBitRateInterface->GetInteger();
    mTransmissionMode = HdlcTransmissionModeType( U32( mHdlcTransmissionInterface->GetNumber() ) );
    mHdlcAddr = HdlcAddressType( U32( mHdlcAddrInterface->GetNumber() ) );
    mHdlcControl = HdlcControlType( U32( mHdlcControlInterface->GetNumber() ) );
    mHdlcFcs = HdlcFcsType( U32( mHdlcFcsInterface->GetNumber() ) );

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", true );

    return true;
}